

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::internalAppendTag(TestCaseInfo *this,StringRef tagStr)

{
  StringRef rhs;
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RDI;
  size_type backingEnd;
  size_type backingStart;
  string *in_stack_ffffffffffffffb0;
  StringRef *in_stack_ffffffffffffffb8;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x30),'[');
  lVar1 = std::__cxx11::string::size();
  rhs.m_size = (size_type)in_stack_ffffffffffffffc0;
  rhs.m_start = (char *)in_stack_ffffffffffffffb8;
  operator+=(in_stack_ffffffffffffffb0,rhs);
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x30),']');
  lVar3 = std::__cxx11::string::c_str();
  StringRef::StringRef((StringRef *)&stack0xffffffffffffffb8,(char *)(lVar3 + lVar1),lVar2 - lVar1);
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::emplace_back<Catch::StringRef>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void TestCaseInfo::internalAppendTag(StringRef tagStr) {
        backingTags += '[';
        const auto backingStart = backingTags.size();
        backingTags += tagStr;
        const auto backingEnd = backingTags.size();
        backingTags += ']';
        tags.emplace_back(StringRef(backingTags.c_str() + backingStart, backingEnd - backingStart));
    }